

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int OptInit(char **a,s_options *o,FILE *err)

{
  option_type oVar1;
  char *__s1;
  code *pcVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  s_options *psVar7;
  char *pcVar8;
  char *pcVar9;
  int n;
  long lVar10;
  long lVar11;
  char **ppcVar12;
  char **ppcVar13;
  double dVar14;
  char *local_48;
  char **local_40;
  double local_38;
  
  argv = a;
  op = o;
  errstream = err;
  if ((((a != (char **)0x0) && (o != (s_options *)0x0)) && (*a != (char *)0x0)) &&
     (pcVar9 = a[1], pcVar9 != (char *)0x0)) {
    lVar11 = 1;
    iVar6 = 0;
    local_40 = a;
    do {
      psVar7 = op;
      ppcVar13 = argv;
      n = (int)lVar11;
      if ((*pcVar9 == '-') || (*pcVar9 == '+')) {
        pcVar9 = op->label;
        if (pcVar9 == (char *)0x0) {
          lVar10 = 0;
        }
        else {
          pcVar8 = argv[lVar11];
          ppcVar12 = &op[1].label;
          lVar10 = 0;
          do {
            sVar4 = strlen(pcVar9);
            iVar3 = strncmp(pcVar8 + 1,pcVar9,(long)(int)sVar4);
            if (iVar3 == 0) break;
            lVar10 = lVar10 + 1;
            pcVar9 = *ppcVar12;
            ppcVar12 = ppcVar12 + 4;
          } while (pcVar9 != (char *)0x0);
        }
        if (psVar7[lVar10].label == (char *)0x0) {
          if (err == (FILE *)0x0) {
LAB_00105fba:
            iVar3 = 1;
          }
          else {
            pcVar9 = "%sundefined option.\n";
LAB_00105f95:
            fprintf((FILE *)err,pcVar9,emsg);
            iVar3 = 1;
            errline(n,1,err);
          }
        }
        else {
          psVar7 = psVar7 + lVar10;
          pcVar2 = (code *)psVar7->arg;
          iVar3 = 0;
          if (pcVar2 != (code *)0x0) {
            oVar1 = psVar7->type;
            if (oVar1 == OPT_FSTR) {
              (*pcVar2)(ppcVar13[lVar11] + 2);
            }
            else if (oVar1 == OPT_FFLAG) {
              (*pcVar2)();
            }
            else {
              if (oVar1 != OPT_FLAG) {
                if (err == (FILE *)0x0) goto LAB_00105fba;
                pcVar9 = "%smissing argument on switch.\n";
                goto LAB_00105f95;
              }
              *(uint *)pcVar2 = (uint)(*ppcVar13[lVar11] == '-');
            }
          }
        }
        iVar6 = iVar6 + iVar3;
      }
      else {
        pcVar9 = strchr(pcVar9,0x3d);
        if (pcVar9 != (char *)0x0) {
          pcVar9 = strchr(ppcVar13[lVar11],0x3d);
          if (pcVar9 == (char *)0x0) {
            __assert_fail("cp!=0",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                          ,0x77f,"int handleswitch(int, FILE *)");
          }
          *pcVar9 = '\0';
          psVar7 = op;
          pcVar8 = op->label;
          if (pcVar8 == (char *)0x0) {
            lVar10 = 0;
          }
          else {
            __s1 = ppcVar13[lVar11];
            ppcVar13 = &op[1].label;
            lVar10 = 0;
            do {
              iVar3 = strcmp(__s1,pcVar8);
              if (iVar3 == 0) break;
              lVar10 = lVar10 + 1;
              pcVar8 = *ppcVar13;
              ppcVar13 = ppcVar13 + 4;
            } while (pcVar8 != (char *)0x0);
          }
          *pcVar9 = '=';
          if (psVar7[lVar10].label == (char *)0x0) {
            iVar3 = 1;
            if (err != (FILE *)0x0) {
              fprintf((FILE *)err,"%sundefined option.\n",emsg);
              errline(n,0,err);
            }
          }
          else {
            oVar1 = psVar7[lVar10].type;
            dVar14 = 0.0;
            if (oVar1 - OPT_FLAG < 8) {
              pcVar9 = pcVar9 + 1;
              switch(oVar1) {
              default:
                if (err != (FILE *)0x0) {
                  fprintf((FILE *)err,"%soption requires an argument.\n",emsg);
                  errline(n,0,err);
                  dVar14 = 0.0;
                }
                break;
              case OPT_INT:
              case OPT_FINT:
                iVar3 = 0;
                uVar5 = strtol(pcVar9,&local_48,0);
                pcVar9 = local_48;
                if ((*local_48 != '\0') && (iVar3 = 1, err != (FILE *)0x0)) {
                  fprintf((FILE *)err,"%sillegal character in integer argument.\n",emsg);
                  errline(n,(int)pcVar9 - *(int *)(argv + lVar11),err);
                }
                pcVar9 = (char *)0x0;
                dVar14 = 0.0;
                goto LAB_0010609f;
              case OPT_DBL:
              case OPT_FDBL:
                dVar14 = strtod(pcVar9,&local_48);
                pcVar9 = local_48;
                if (*local_48 == '\0') goto LAB_0010609a;
                if (err != (FILE *)0x0) {
                  local_38 = dVar14;
                  fprintf((FILE *)err,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar9 - *(int *)(argv + lVar11),err);
                  dVar14 = local_38;
                }
                break;
              case OPT_STR:
              case OPT_FSTR:
                goto switchD_00105ef6_caseD_4;
              }
              uVar5 = 0;
              iVar3 = 1;
              pcVar9 = (char *)0x0;
            }
            else {
LAB_0010609a:
              pcVar9 = (char *)0x0;
switchD_00105ef6_caseD_4:
              uVar5 = 0;
              iVar3 = 0;
            }
LAB_0010609f:
            switch(op[lVar10].type) {
            case OPT_INT:
              *(int *)op[lVar10].arg = (int)uVar5;
              break;
            case OPT_DBL:
              *(double *)op[lVar10].arg = dVar14;
              break;
            case OPT_STR:
              *(char **)op[lVar10].arg = pcVar9;
              break;
            case OPT_FINT:
              (*(code *)op[lVar10].arg)(uVar5 & 0xffffffff);
              break;
            case OPT_FDBL:
              (*(code *)op[lVar10].arg)();
              break;
            case OPT_FSTR:
              (*(code *)op[lVar10].arg)(pcVar9);
            }
          }
          iVar6 = iVar3 + iVar6;
        }
      }
      pcVar9 = argv[lVar11 + 1];
      lVar11 = lVar11 + 1;
    } while (pcVar9 != (char *)0x0);
    if (0 < iVar6) {
      fprintf((FILE *)err,"Valid command line options for \"%s\" are:\n",*local_40);
      OptPrint();
      exit(1);
    }
  }
  return 0;
}

Assistant:

int OptInit(char **a, struct s_options *o, FILE *err)
{
  int errcnt = 0;
  argv = a;
  op = o;
  errstream = err;
  if( argv && *argv && op ){
    int i;
    for(i=1; argv[i]; i++){
      if( argv[i][0]=='+' || argv[i][0]=='-' ){
        errcnt += handleflags(i,err);
      }else if( strchr(argv[i],'=') ){
        errcnt += handleswitch(i,err);
      }
    }
  }
  if( errcnt>0 ){
    fprintf(err,"Valid command line options for \"%s\" are:\n",*a);
    OptPrint();
    exit(1);
  }
  return 0;
}